

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O3

shared_ptr<SchemeObject> evaluate_string_in_global_context(string *s)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  ostream *poVar3;
  int iVar4;
  undefined8 *in_RSI;
  SchemeObject *__tmp;
  pointer pcVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  shared_ptr<SchemeObject> sVar6;
  istringstream is;
  pointer local_238;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_230;
  parse_result_t local_220;
  ASTNode *local_218;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_210;
  char *local_208;
  long local_200;
  char local_1f8;
  undefined7 uStack_1f7;
  undefined1 local_1e8 [24];
  _Alloc_hider local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  istringstream local_1b0 [16];
  string local_1a0 [104];
  ios_base local_138 [264];
  
  std::__cxx11::istringstream::istringstream(local_1b0);
  std::__cxx11::stringbuf::str(local_1a0);
  local_220 = END;
  local_218 = (ASTNode *)0x0;
  p_Stack_210 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_208 = &local_1f8;
  local_200 = 0;
  local_1f8 = '\0';
  (s->_M_dataplus)._M_p = (pointer)0x0;
  s->_M_string_length = 0;
  iVar4 = 1;
  pcVar5 = (pointer)0x0;
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    read_object((ParseResult *)local_1e8,(istream *)local_1b0);
    uVar2 = local_1e8._16_8_;
    local_218 = (ASTNode *)local_1e8._8_8_;
    p_Var1 = p_Stack_210;
    local_220 = local_1e8._0_4_;
    local_1e8._8_8_ = (ASTNode *)0x0;
    local_1e8._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Stack_210 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    std::__cxx11::string::operator=((string *)&local_208,(string *)&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_p != &local_1c0) {
      operator_delete(local_1d0._M_p,local_1c0._M_allocated_capacity + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._16_8_);
    }
    if (local_220 == END) break;
    if (local_220 == ERROR) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"FAILED\nCould not parse expression ",0x22);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," in ",4);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)*in_RSI,in_RSI[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_208,local_200);
      std::endl<char,std::char_traits<char>>(poVar3);
LAB_00117101:
      exit(1);
    }
    ASTNode::evaluate((ExecutionResult *)local_1e8,local_218,&global_context);
    ExecutionResult::force_value((ExecutionResult *)&local_238);
    p_Var1 = p_Stack_230;
    pcVar5 = local_238;
    local_238 = (pointer)0x0;
    p_Stack_230 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (s->_M_dataplus)._M_p = pcVar5;
    s->_M_string_length = (size_type)p_Var1;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      if (p_Stack_230 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_230);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::default_delete<TailContext>::operator()
                ((default_delete<TailContext> *)&local_1d0,(TailContext *)local_1d0._M_p);
    }
    local_1d0._M_p = (pointer)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._16_8_);
    }
    iVar4 = iVar4 + 1;
    this = p_Var1;
  }
  if (pcVar5 != (pointer)0x0) {
    if (local_208 != &local_1f8) {
      operator_delete(local_208,CONCAT71(uStack_1f7,local_1f8) + 1);
    }
    if (p_Stack_210 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_210);
    }
    std::__cxx11::istringstream::~istringstream(local_1b0);
    sVar6.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> =
         (__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)std::ios_base::~ios_base(local_138)
    ;
    return (shared_ptr<SchemeObject>)
           sVar6.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"FAILED\nNothing to execute",0x19);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  goto LAB_00117101;
}

Assistant:

static std::shared_ptr<SchemeObject> evaluate_string_in_global_context(const std::string &s)
{
    std::istringstream is;
    is.str(s);
    ParseResult parsed;
    std::shared_ptr<SchemeObject> object{nullptr};
    int expression_index = 0;
    while(true)
    {
        ++expression_index;
        parsed = read_object(is);
        if(parsed.result == parse_result_t::END)
        {
            if(!object)
            {
                std::cout << "FAILED\nNothing to execute" << std::endl;
                exit(1);
            }
            break;
        }
        if(parsed.result == parse_result_t::ERROR)
        {
            std::cout << "FAILED\nCould not parse expression " << expression_index << " in " << s << ": "
                      << parsed.error << std::endl;
            exit(1);
        }
        try
        {
            object = parsed.node->evaluate(global_context).force_value();
        }
        catch(eval_error &e)
        {
            std::cout << "FAILED\nCould not evaluate expression " << expression_index << " in " << s << ": "
                      << e.what() << std::endl;
            exit(1);
        }
    }
    return object;
}